

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
::
nosize_unchecked_emplace_at<std::pair<slang::syntax::SyntaxNode_const*&&,slang::ast::Compilation::SyntaxMetadata&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<const_slang::syntax::SyntaxNode_*&&,_slang::ast::Compilation::SyntaxMetadata_&&>
          *args)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  SyntaxMetadata *pSVar3;
  uint uVar4;
  ushort uVar5;
  SyntaxTree *pSVar6;
  NetType *pNVar7;
  undefined3 uVar8;
  UnconnectedDrive UVar9;
  bool bVar10;
  undefined3 uVar11;
  ulong uVar12;
  value_type_pointer ppVar13;
  long lVar14;
  group_type_pointer pgVar15;
  undefined1 auVar16 [16];
  
  pgVar15 = __return_storage_ptr__->pg;
  uVar12 = (ulong)__return_storage_ptr__->n;
  ppVar13 = __return_storage_ptr__->p;
  lVar14 = 1;
  while( true ) {
    pgVar1 = arrays_->groups_ + pos0;
    pgVar2 = arrays_->groups_ + pos0;
    auVar16[0] = -(pgVar2->m[0].n == '\0');
    auVar16[1] = -(pgVar2->m[1].n == '\0');
    auVar16[2] = -(pgVar2->m[2].n == '\0');
    auVar16[3] = -(pgVar2->m[3].n == '\0');
    auVar16[4] = -(pgVar2->m[4].n == '\0');
    auVar16[5] = -(pgVar2->m[5].n == '\0');
    auVar16[6] = -(pgVar2->m[6].n == '\0');
    auVar16[7] = -(pgVar2->m[7].n == '\0');
    auVar16[8] = -(pgVar2->m[8].n == '\0');
    auVar16[9] = -(pgVar2->m[9].n == '\0');
    auVar16[10] = -(pgVar2->m[10].n == '\0');
    auVar16[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar16[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar16[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar16[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar16[0xf] = -(pgVar2->m[0xf].n == '\0');
    uVar5 = (ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe;
    if (uVar5 == 0) {
      pgVar1->m[0xf].n = pgVar1->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar4 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar12 = (ulong)uVar4;
      ppVar13 = arrays_->elements_ + pos0 * 0xf + uVar12;
      ppVar13->first = *args->first;
      pSVar3 = args->second;
      pSVar6 = pSVar3->tree;
      pNVar7 = pSVar3->defaultNetType;
      uVar8 = *(undefined3 *)&pSVar3->field_0x15;
      UVar9 = pSVar3->unconnectedDrive;
      bVar10 = pSVar3->cellDefine;
      uVar11 = *(undefined3 *)&pSVar3->field_0x1d;
      (ppVar13->second).timeScale =
           (_Optional_base<slang::TimeScale,_true,_true>)
           (pSVar3->timeScale).super__Optional_base<slang::TimeScale,_true,_true>;
      *(undefined3 *)&(ppVar13->second).field_0x15 = uVar8;
      (ppVar13->second).unconnectedDrive = UVar9;
      (ppVar13->second).cellDefine = bVar10;
      *(undefined3 *)&(ppVar13->second).field_0x1d = uVar11;
      (ppVar13->second).tree = pSVar6;
      (ppVar13->second).defaultNetType = pNVar7;
      pgVar1->m[uVar12].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar15 = pgVar1;
    }
    if (uVar5 != 0) break;
    pos0 = pos0 + lVar14 & arrays_->groups_size_mask;
    lVar14 = lVar14 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar12;
  __return_storage_ptr__->p = ppVar13;
  __return_storage_ptr__->pg = pgVar15;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }